

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O0

void __thiscall
Minisat::Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::insert
          (Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_> *this,int k)

{
  bool bVar1;
  Size SVar2;
  int *piVar3;
  int local_14;
  Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_> *pHStack_10;
  int k_local;
  Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_> *this_local;
  
  local_14 = k;
  pHStack_10 = this;
  IntMap<int,_int,_Minisat::MkIndexDefault<int>_>::reserve(&this->indices,k,-1);
  bVar1 = inHeap(this,local_14);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!inHeap(k)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/Heap.h"
                  ,0x66,
                  "void Minisat::Heap<int, Minisat::SimpSolver::ElimLt>::insert(K) [K = int, Comp = Minisat::SimpSolver::ElimLt, MkIndex = Minisat::MkIndexDefault<int>]"
                 );
  }
  SVar2 = vec<int,_int>::size(&this->heap);
  piVar3 = IntMap<int,_int,_Minisat::MkIndexDefault<int>_>::operator[](&this->indices,local_14);
  *piVar3 = SVar2;
  vec<int,_int>::push(&this->heap,&local_14);
  piVar3 = IntMap<int,_int,_Minisat::MkIndexDefault<int>_>::operator[](&this->indices,local_14);
  percolateUp(this,*piVar3);
  return;
}

Assistant:

void insert(K k)
    {
        indices.reserve(k, -1);
        assert(!inHeap(k));

        indices[k] = heap.size();
        heap.push(k);
        percolateUp(indices[k]);
    }